

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNA.cpp
# Opt level: O3

unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> __thiscall
Storage::State::SNA::load(SNA *this,string *file_name)

{
  Struct *pSVar1;
  void *pvVar2;
  pointer puVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  stat *psVar9;
  Target *this_00;
  State *this_01;
  size_t __nbytes;
  FileHolder file;
  undefined1 local_128 [264];
  
  FileHolder::FileHolder((FileHolder *)(local_128 + 0x20),file_name,ReadWrite);
  psVar9 = FileHolder::stats((FileHolder *)(local_128 + 0x20));
  if (psVar9->st_size == 0xc01b) {
    this_00 = (Target *)operator_new(0x90);
    Analyser::Static::ZXSpectrum::Target::Target(this_00);
    this_00->model = FortyEightK;
    this_01 = (State *)operator_new(0xe0);
    Sinclair::ZXSpectrum::State::State(this_01);
    pSVar1 = (this_00->super_Target).state._M_t.
             super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>.
             _M_t.
             super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
             super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl;
    (this_00->super_Target).state._M_t.
    super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
    super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
    super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl = (Struct *)this_01;
    if (pSVar1 != (Struct *)0x0) {
      (*pSVar1->_vptr_Struct[8])();
    }
    bVar4 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.hl_dash = uVar8;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.de_dash = uVar8;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.bc_dash = uVar8;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.af_dash = uVar8;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    *(uint8_t *)&(this_01->z80).registers.hl = (char)uVar8;
    *(char *)((long)&(this_01->z80).registers.hl + 1) = (char)(uVar8 >> 8);
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    *(uint8_t *)&(this_01->z80).registers.de = (char)uVar8;
    *(char *)((long)&(this_01->z80).registers.de + 1) = (char)(uVar8 >> 8);
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    *(uint8_t *)&(this_01->z80).registers.bc = (char)uVar8;
    *(char *)((long)&(this_01->z80).registers.bc + 1) = (char)(uVar8 >> 8);
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.iy = uVar8;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.ix = uVar8;
    bVar5 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    bVar6 = (bool)(bVar5 >> 2 & 1);
    (this_01->z80).registers.iff2 = bVar6;
    (this_01->z80).registers.iff1 = bVar6;
    bVar5 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    __nbytes = (ulong)bVar4 << 8;
    (this_01->z80).registers.ir = (ushort)bVar5 | (ushort)__nbytes;
    uVar7 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.flags = uVar7;
    uVar7 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.a = uVar7;
    uVar8 = FileHolder::get16le((FileHolder *)(local_128 + 0x20));
    (this_01->z80).registers.stack_pointer = uVar8;
    bVar4 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    *(uint16_t *)&(this_01->z80).registers.interrupt_mode = (short)(uint)bVar4;
    *(short *)((long)&(this_01->z80).registers.interrupt_mode + 2) = (short)((uint)bVar4 >> 0x10);
    uVar7 = FileHolder::get8((FileHolder *)(local_128 + 0x20));
    (this_01->video).border_colour = uVar7;
    FileHolder::read((FileHolder *)local_128,(int)local_128 + 0x20,(void *)0xc000,__nbytes);
    pvVar2 = *(void **)&(this_01->ram).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    puVar3 = (this_01->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)
     &(this_01->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl =
         local_128._0_8_;
    (this_01->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
    (this_01->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
    local_128._0_8_ = (FILE *)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)puVar3 - (long)pvVar2);
      if ((FILE *)local_128._0_8_ != (FILE *)0x0) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
      }
    }
    (this_01->z80).registers.program_counter = 0x1d83;
  }
  else {
    this_00 = (Target *)0x0;
  }
  *(Target **)this = this_00;
  FileHolder::~FileHolder((FileHolder *)(local_128 + 0x20));
  return (__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
          )(__uniq_ptr_data<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Analyser::Static::Target> SNA::load(const std::string &file_name) {
	// Make sure the file is accessible and appropriately sized.
	FileHolder file(file_name);
	if(file.stats().st_size != 48*1024 + 0x1b) {
		return nullptr;
	}

	// SNAs are always for 48kb machines.
	using Target = Analyser::Static::ZXSpectrum::Target;
	auto result = std::make_unique<Target>();
	result->model = Target::Model::FortyEightK;

	// Prepare to populate ZX Spectrum state.
	auto *const state = new Sinclair::ZXSpectrum::State();
	result->state = std::unique_ptr<Reflection::Struct>(state);

	// Comments below: [offset] [contents]

	//	00	I
	const uint8_t i = file.get8();

	//	01	HL';	03	DE';	05	BC';	07	AF'
	state->z80.registers.hl_dash = file.get16le();
	state->z80.registers.de_dash = file.get16le();
	state->z80.registers.bc_dash = file.get16le();
	state->z80.registers.af_dash = file.get16le();

	//	09	HL;		0B	DE;		0D	BC;		0F	IY;		11	IX
	state->z80.registers.hl = file.get16le();
	state->z80.registers.de = file.get16le();
	state->z80.registers.bc = file.get16le();
	state->z80.registers.iy = file.get16le();
	state->z80.registers.ix = file.get16le();

	//	13	IFF2 (in bit 2)
	const uint8_t iff = file.get8();
	state->z80.registers.iff1 = state->z80.registers.iff2 = iff & 4;

	//	14	R
	const uint8_t r = file.get8();
	state->z80.registers.ir = uint16_t((i << 8) | r);

	//	15	AF;		17	SP;		19	interrupt mode
	state->z80.registers.flags = file.get8();
	state->z80.registers.a = file.get8();
	state->z80.registers.stack_pointer = file.get16le();
	state->z80.registers.interrupt_mode = file.get8();

	//	1A	border colour
	state->video.border_colour = file.get8();

	//	1B–	48kb RAM contents
	state->ram = file.read(48*1024);

	// To establish program counter, point it to a RET that
	// I know is in the 16/48kb ROM. This avoids having to
	// try to do a pop here, given that the true program counter
	// might currently be in the ROM.
	state->z80.registers.program_counter = 0x1d83;

	return result;
}